

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int IoCommandReadTruth(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pSop;
  Abc_Ntk_t *pNtk;
  FILE *__s;
  char *pcVar5;
  size_t sStack_40;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  bVar2 = true;
  while( true ) {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"xfh"), iVar3 == 0x66) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar3 == -1) break;
    if (iVar3 != 0x78) goto LAB_002d3d70;
    bVar2 = (bool)(bVar2 ^ 1);
  }
  if (globalUtilOptind + 1 == argc) {
    pcVar5 = argv[globalUtilOptind];
    if (bVar1) {
      pcVar5 = Extra_FileReadContents(pcVar5);
    }
    while( true ) {
      sVar4 = strlen(pcVar5);
      if ((pcVar5[sVar4 - 1] != '\r') && (pcVar5[sVar4 - 1] != '\n')) break;
      pcVar5[sVar4 - 1] = '\0';
    }
    if (bVar2) {
      pSop = Abc_SopFromTruthHex(pcVar5);
    }
    else {
      pSop = Abc_SopFromTruthBin(pcVar5);
    }
    if (bVar1) {
      free(pcVar5);
    }
    if ((pSop == (char *)0x0) || (*pSop == '\0')) {
      free(pSop);
      __s = (FILE *)pAbc->Err;
      pcVar5 = "Reading truth table has failed.\n";
      sStack_40 = 0x20;
    }
    else {
      pNtk = Abc_NtkCreateWithNode(pSop);
      free(pSop);
      if (pNtk != (Abc_Ntk_t *)0x0) {
        Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
        Abc_FrameClearVerifStatus(pAbc);
        return 0;
      }
      __s = (FILE *)pAbc->Err;
      pcVar5 = "Deriving the network has failed.\n";
      sStack_40 = 0x21;
    }
    goto LAB_002d3ead;
  }
LAB_002d3d70:
  fwrite("usage: read_truth [-xfh] <truth> <file>\n",0x28,1,(FILE *)pAbc->Err);
  fwrite("\t         creates network with node having given truth table\n",0x3d,1,(FILE *)pAbc->Err)
  ;
  pcVar5 = "hex";
  if (!bVar2) {
    pcVar5 = "bin";
  }
  fprintf((FILE *)pAbc->Err,"\t-x     : toggles between bin and hex representation [default = %s]\n"
          ,pcVar5);
  pcVar5 = "yes";
  if (!bVar1) {
    pcVar5 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-f     : toggles reading truth table from file [default = %s]\n",
          pcVar5);
  fwrite("\t-h     : prints the command summary\n",0x25,1,(FILE *)pAbc->Err);
  fwrite("\ttruth  : truth table with most signficant bit first (e.g. 1000 for AND(a,b))\n",0x4e,1,
         (FILE *)pAbc->Err);
  __s = (FILE *)pAbc->Err;
  pcVar5 = "\tfile   : file name with the truth table\n";
  sStack_40 = 0x29;
LAB_002d3ead:
  fwrite(pcVar5,sStack_40,1,__s);
  return 1;
}

Assistant:

int IoCommandReadTruth( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    char * pStr = NULL;
    char * pSopCover;
    int fHex  = 1;
    int fFile = 0;
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "xfh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'x':
                fHex ^= 1;
                break;
            case 'f':
                fFile ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }

    if ( argc != globalUtilOptind + 1 )
        goto usage;

    if ( fFile )
        pStr = Extra_FileReadContents( argv[globalUtilOptind] );
    else
        pStr = argv[globalUtilOptind];
    while ( pStr[ strlen(pStr) - 1 ] == '\n' || pStr[ strlen(pStr) - 1 ] == '\r' )
        pStr[ strlen(pStr) - 1 ] = '\0';

    // convert truth table to SOP
    if ( fHex )
        pSopCover = Abc_SopFromTruthHex(pStr);
    else
        pSopCover = Abc_SopFromTruthBin(pStr);
    if ( fFile )
        ABC_FREE( pStr );
    if ( pSopCover == NULL || pSopCover[0] == 0 )
    {
        ABC_FREE( pSopCover );
        fprintf( pAbc->Err, "Reading truth table has failed.\n" );
        return 1;
    }

    pNtk = Abc_NtkCreateWithNode( pSopCover );
    ABC_FREE( pSopCover );
    if ( pNtk == NULL )
    {
        fprintf( pAbc->Err, "Deriving the network has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_truth [-xfh] <truth> <file>\n" );
    fprintf( pAbc->Err, "\t         creates network with node having given truth table\n" );
    fprintf( pAbc->Err, "\t-x     : toggles between bin and hex representation [default = %s]\n", fHex?  "hex":"bin" );
    fprintf( pAbc->Err, "\t-f     : toggles reading truth table from file [default = %s]\n",      fFile? "yes": "no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\ttruth  : truth table with most signficant bit first (e.g. 1000 for AND(a,b))\n" );
    fprintf( pAbc->Err, "\tfile   : file name with the truth table\n" );
    return 1;
}